

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O1

void uv__wait_children(uv_loop_t *loop)

{
  uv_process_t *puVar1;
  int iVar2;
  int *piVar3;
  bool bVar4;
  uv__queue *h;
  uv__queue *q;
  uv__queue pending;
  pid_t pid;
  int options;
  int status;
  int term_signal;
  int exit_status;
  uv_process_t *process;
  uv_loop_t *loop_local;
  
  process = (uv_process_t *)loop;
  uv__queue_init((uv__queue *)&q);
  puVar1 = process + 2;
  h = uv__queue_head((uv__queue *)&puVar1->exit_cb);
  while (h != (uv__queue *)&puVar1->exit_cb) {
    _term_signal = h + -7;
    h = uv__queue_next(h);
    do {
      pending.prev._4_4_ = waitpid(*(__pid_t *)&_term_signal[6].prev,&pid,1);
      bVar4 = false;
      if (pending.prev._4_4_ == -1) {
        piVar3 = __errno_location();
        bVar4 = *piVar3 == 4;
      }
    } while (bVar4);
    if (pending.prev._4_4_ != 0) {
      if (pending.prev._4_4_ == -1) {
        piVar3 = __errno_location();
        if (*piVar3 != 10) {
          abort();
        }
      }
      else {
        if (pending.prev._4_4_ != *(int *)&_term_signal[6].prev) {
          __assert_fail("pid == process->pid",
                        "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]http-server/deps/libuv/src/unix/process.c"
                        ,0x96,"void uv__wait_children(uv_loop_t *)");
        }
        *(pid_t *)&_term_signal[8].next = pid;
        uv__queue_remove(_term_signal + 7);
        uv__queue_insert_tail((uv__queue *)&q,_term_signal + 7);
      }
    }
  }
  h = uv__queue_head((uv__queue *)&q);
  while (h != (uv__queue *)&q) {
    _term_signal = h + -7;
    h = uv__queue_next(h);
    uv__queue_remove(_term_signal + 7);
    uv__queue_init(_term_signal + 7);
    if ((((ulong)_term_signal[5].prev & 4) != 0) &&
       (*(uint *)&_term_signal[5].prev = *(uint *)&_term_signal[5].prev & 0xfffffffb,
       ((ulong)_term_signal[5].prev & 8) != 0)) {
      *(int *)&_term_signal->prev->prev = *(int *)&_term_signal->prev->prev + -1;
    }
    if (_term_signal[6].next != (uv__queue *)0x0) {
      status = 0;
      if (((ulong)_term_signal[8].next & 0x7f) == 0) {
        status = (int)(*(uint *)&_term_signal[8].next & 0xff00) >> 8;
      }
      options = 0;
      if ('\0' < (char)(((byte)*(undefined4 *)&_term_signal[8].next & 0x7f) + 1) >> 1) {
        options = *(uint *)&_term_signal[8].next & 0x7f;
      }
      (*(code *)_term_signal[6].next)(_term_signal,status,options);
    }
  }
  iVar2 = uv__queue_empty((uv__queue *)&q);
  if (iVar2 == 0) {
    __assert_fail("uv__queue_empty(&pending)",
                  "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]http-server/deps/libuv/src/unix/process.c"
                  ,0xb3,"void uv__wait_children(uv_loop_t *)");
  }
  return;
}

Assistant:

void uv__wait_children(uv_loop_t* loop) {
  uv_process_t* process;
  int exit_status;
  int term_signal;
  int status;
  int options;
  pid_t pid;
  struct uv__queue pending;
  struct uv__queue* q;
  struct uv__queue* h;

  uv__queue_init(&pending);

  h = &loop->process_handles;
  q = uv__queue_head(h);
  while (q != h) {
    process = uv__queue_data(q, uv_process_t, queue);
    q = uv__queue_next(q);

#ifndef UV_USE_SIGCHLD
    if ((process->flags & UV_HANDLE_REAP) == 0)
      continue;
    options = 0;
    process->flags &= ~UV_HANDLE_REAP;
    loop->nfds--;
#else
    options = WNOHANG;
#endif

    do
      pid = waitpid(process->pid, &status, options);
    while (pid == -1 && errno == EINTR);

#ifdef UV_USE_SIGCHLD
    if (pid == 0) /* Not yet exited */
      continue;
#endif

    if (pid == -1) {
      if (errno != ECHILD)
        abort();
      /* The child died, and we missed it. This probably means someone else
       * stole the waitpid from us. Handle this by not handling it at all. */
      continue;
    }

    assert(pid == process->pid);
    process->status = status;
    uv__queue_remove(&process->queue);
    uv__queue_insert_tail(&pending, &process->queue);
  }

  h = &pending;
  q = uv__queue_head(h);
  while (q != h) {
    process = uv__queue_data(q, uv_process_t, queue);
    q = uv__queue_next(q);

    uv__queue_remove(&process->queue);
    uv__queue_init(&process->queue);
    uv__handle_stop(process);

    if (process->exit_cb == NULL)
      continue;

    exit_status = 0;
    if (WIFEXITED(process->status))
      exit_status = WEXITSTATUS(process->status);

    term_signal = 0;
    if (WIFSIGNALED(process->status))
      term_signal = WTERMSIG(process->status);

    process->exit_cb(process, exit_status, term_signal);
  }
  assert(uv__queue_empty(&pending));
}